

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::dense_hashtable(dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *this,size_type expected_max_items_in_table,TransparentHasher *hf,
                 TransparentHasher *eql,Identity *ext,SetKey *set,
                 Alloc<int,_unsigned_long,_18446744073709551615UL> *alloc)

{
  int *piVar1;
  int iVar2;
  undefined4 uVar3;
  size_type num_buckets;
  
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.num_compares_ = (hf->super_Hasher).num_compares_;
  iVar2 = (hf->super_Hasher).num_hashes_;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.id_ = (hf->super_Hasher).id_;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.num_hashes_ = iVar2;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.use_empty_
       = false;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_deleted_ = false;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  iVar2 = (eql->super_Hasher).num_hashes_;
  (this->key_info).super_TransparentHasher.super_Hasher.id_ = (eql->super_Hasher).id_;
  (this->key_info).super_TransparentHasher.super_Hasher.num_hashes_ = iVar2;
  (this->key_info).super_TransparentHasher.super_Hasher.num_compares_ =
       (eql->super_Hasher).num_compares_;
  (this->key_info).delkey = 0;
  (this->key_info).empty_key = 0;
  this->num_deleted = 0;
  this->num_elements = 0;
  if (expected_max_items_in_table == 0) {
    num_buckets = 0x20;
  }
  else {
    num_buckets = sparsehash_internal::
                  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::min_buckets
                            ((sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)this
                             ,expected_max_items_in_table,0);
  }
  this->num_buckets = num_buckets;
  uVar3 = *(undefined4 *)&alloc->field_0x4;
  piVar1 = alloc->count_;
  (this->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<int,_unsigned_long,_18446744073709551615UL>.id_ = alloc->id_;
  *(undefined4 *)
   &(this->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
    super_Alloc<int,_unsigned_long,_18446744073709551615UL>.field_0x4 = uVar3;
  (this->val_info).super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
  super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_ = piVar1;
  this->table = (pointer)0x0;
  sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)this,
                   num_buckets);
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        val_info(alloc_impl<value_alloc_type>(alloc)),
        table(NULL) {
    // table is NULL until emptyval is set.  However, we set num_buckets
    // here so we know how much space to allocate once emptyval is set
    settings.reset_thresholds(bucket_count());
  }